

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdhuff.c
# Opt level: O1

void start_pass_huff_decoder(j_decompress_ptr cinfo)

{
  jpeg_entropy_decoder *pjVar1;
  jpeg_component_info *pjVar2;
  jpeg_error_mgr *pjVar3;
  code *pcVar4;
  code *pcVar5;
  int (*paiVar6) [64];
  int iVar7;
  int iVar8;
  int (*paiVar9) [8];
  long lVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  bool bVar14;
  
  pjVar1 = cinfo->entropy;
  iVar8 = cinfo->Ss;
  if (cinfo->progressive_mode == 0) {
    if ((((iVar8 != 0) || (cinfo->Ah != 0)) || (cinfo->Al != 0)) ||
       (((cinfo->is_baseline != 0 || (cinfo->Se < 0x40)) && (cinfo->Se != cinfo->lim_Se)))) {
      pjVar3 = cinfo->err;
      pjVar3->msg_code = 0x7d;
      (*pjVar3->emit_message)((j_common_ptr)cinfo,-1);
    }
    pcVar4 = decode_mcu_sub;
    if (cinfo->lim_Se == 0x3f) {
      pcVar4 = decode_mcu;
    }
    pjVar1->decode_mcu = pcVar4;
    if (0 < cinfo->comps_in_scan) {
      lVar10 = 0;
      do {
        pjVar2 = cinfo->cur_comp_info[lVar10];
        iVar8 = pjVar2->dc_tbl_no;
        jpeg_make_d_derived_tbl(cinfo,1,iVar8,(d_derived_tbl **)(&pjVar1[6].decode_mcu + iVar8));
        if (cinfo->lim_Se != 0) {
          iVar8 = pjVar2->ac_tbl_no;
          jpeg_make_d_derived_tbl(cinfo,0,iVar8,(d_derived_tbl **)(&pjVar1[8].decode_mcu + iVar8));
        }
        *(undefined4 *)((long)&pjVar1[2].start_pass + lVar10 * 4 + 4) = 0;
        lVar10 = lVar10 + 1;
      } while (lVar10 < cinfo->comps_in_scan);
    }
    if (0 < cinfo->blocks_in_MCU) {
      lVar10 = 0;
      do {
        pjVar2 = cinfo->cur_comp_info[cinfo->MCU_membership[lVar10]];
        (&pjVar1[10].decode_mcu)[lVar10] = (&pjVar1[6].decode_mcu)[pjVar2->dc_tbl_no];
        (&pjVar1[0xf].decode_mcu)[lVar10] = (&pjVar1[8].decode_mcu)[pjVar2->ac_tbl_no];
        iVar8 = 0;
        if (pjVar2->component_needed != 0) {
          iVar8 = pjVar2->DCT_h_scaled_size;
          iVar13 = pjVar2->DCT_v_scaled_size;
          iVar7 = cinfo->lim_Se;
          if (iVar7 < 0xf) {
            if (iVar7 == 0) {
              iVar8 = 1;
              goto LAB_0011052d;
            }
            if (iVar7 == 3) {
              iVar7 = 1;
              iVar11 = 1;
              if (0xfffffffd < iVar13 - 3U) {
                iVar11 = iVar13 + -1;
              }
              if (0xfffffffd < iVar8 - 3U) {
                iVar7 = iVar8 + -1;
              }
              lVar12 = (long)iVar7;
              paiVar9 = (int (*) [8])(jpeg_zigzag_order2 + iVar11);
            }
            else {
              if (iVar7 != 8) goto LAB_00110439;
              iVar7 = 2;
              iVar11 = 2;
              if (0xfffffffc < iVar13 - 4U) {
                iVar11 = iVar13 + -1;
              }
              if (0xfffffffc < iVar8 - 4U) {
                iVar7 = iVar8 + -1;
              }
              lVar12 = (long)iVar7;
              paiVar9 = (int (*) [8])(jpeg_zigzag_order3 + iVar11);
            }
          }
          else if (iVar7 < 0x23) {
            if (iVar7 == 0xf) {
              iVar7 = 3;
              iVar11 = 3;
              if (0xfffffffb < iVar13 - 5U) {
                iVar11 = iVar13 + -1;
              }
              if (0xfffffffb < iVar8 - 5U) {
                iVar7 = iVar8 + -1;
              }
              lVar12 = (long)iVar7;
              paiVar9 = (int (*) [8])(jpeg_zigzag_order4 + iVar11);
            }
            else if (iVar7 == 0x18) {
              iVar7 = 4;
              iVar11 = 4;
              if (0xfffffffa < iVar13 - 6U) {
                iVar11 = iVar13 + -1;
              }
              if (0xfffffffa < iVar8 - 6U) {
                iVar7 = iVar8 + -1;
              }
              lVar12 = (long)iVar7;
              paiVar9 = (int (*) [8])(jpeg_zigzag_order5 + iVar11);
            }
            else {
LAB_00110439:
              iVar7 = 7;
              iVar11 = 7;
              if (0xfffffff7 < iVar13 - 9U) {
                iVar11 = iVar13 + -1;
              }
              if (0xfffffff7 < iVar8 - 9U) {
                iVar7 = iVar8 + -1;
              }
              lVar12 = (long)iVar7;
              paiVar9 = jpeg_zigzag_order + iVar11;
            }
          }
          else if (iVar7 == 0x23) {
            iVar7 = 5;
            iVar11 = 5;
            if (0xfffffff9 < iVar13 - 7U) {
              iVar11 = iVar13 + -1;
            }
            if (0xfffffff9 < iVar8 - 7U) {
              iVar7 = iVar8 + -1;
            }
            lVar12 = (long)iVar7;
            paiVar9 = (int (*) [8])(jpeg_zigzag_order6 + iVar11);
          }
          else {
            if (iVar7 != 0x30) goto LAB_00110439;
            iVar7 = 6;
            iVar11 = 6;
            if (0xfffffff8 < iVar13 - 8U) {
              iVar11 = iVar13 + -1;
            }
            if (0xfffffff8 < iVar8 - 8U) {
              iVar7 = iVar8 + -1;
            }
            lVar12 = (long)iVar7;
            paiVar9 = (int (*) [8])(jpeg_zigzag_order7 + iVar11);
          }
          iVar8 = (*paiVar9)[lVar12] + 1;
        }
LAB_0011052d:
        *(int *)((long)&pjVar1[0x14].decode_mcu + lVar10 * 4) = iVar8;
        lVar10 = lVar10 + 1;
      } while (lVar10 < cinfo->blocks_in_MCU);
    }
    goto LAB_00110742;
  }
  iVar13 = cinfo->Se;
  if (iVar8 == 0) {
    if (iVar13 == 0) goto LAB_00110551;
LAB_0011056e:
    pjVar3 = cinfo->err;
    pjVar3->msg_code = 0x11;
    (pjVar3->msg_parm).i[0] = iVar8;
    (cinfo->err->msg_parm).i[1] = cinfo->Se;
    (cinfo->err->msg_parm).i[2] = cinfo->Ah;
    (cinfo->err->msg_parm).i[3] = cinfo->Al;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  else {
    if (((iVar13 < iVar8) || (cinfo->lim_Se < iVar13)) || (cinfo->comps_in_scan != 1))
    goto LAB_0011056e;
LAB_00110551:
    if (((cinfo->Ah != 0) && (cinfo->Ah + -1 != cinfo->Al)) || (0xd < cinfo->Al)) goto LAB_0011056e;
  }
  if (0 < cinfo->comps_in_scan) {
    lVar10 = 0;
    do {
      iVar8 = cinfo->cur_comp_info[lVar10]->component_index;
      paiVar6 = cinfo->coef_bits + iVar8;
      if ((cinfo->Ss != 0) && ((*paiVar6)[0] < 0)) {
        pjVar3 = cinfo->err;
        pjVar3->msg_code = 0x76;
        (pjVar3->msg_parm).i[0] = iVar8;
        (cinfo->err->msg_parm).i[1] = 0;
        (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
      }
      iVar13 = cinfo->Ss;
      if (iVar13 <= cinfo->Se) {
        lVar12 = (long)iVar13 + -1;
        do {
          iVar7 = (*paiVar6)[lVar12 + 1];
          if (iVar7 < 1) {
            iVar7 = 0;
          }
          if (cinfo->Ah != iVar7) {
            pjVar3 = cinfo->err;
            pjVar3->msg_code = 0x76;
            (pjVar3->msg_parm).i[0] = iVar8;
            (cinfo->err->msg_parm).i[1] = iVar13;
            (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
          }
          (*paiVar6)[lVar12 + 1] = cinfo->Al;
          lVar12 = lVar12 + 1;
          iVar13 = iVar13 + 1;
        } while (lVar12 < cinfo->Se);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 < cinfo->comps_in_scan);
  }
  bVar14 = cinfo->Ss == 0;
  pcVar4 = decode_mcu_AC_first;
  if (bVar14) {
    pcVar4 = decode_mcu_DC_first;
  }
  pcVar5 = decode_mcu_AC_refine;
  if (bVar14) {
    pcVar5 = decode_mcu_DC_refine;
  }
  if (cinfo->Ah == 0) {
    pcVar5 = pcVar4;
  }
  pjVar1->decode_mcu = pcVar5;
  if (0 < cinfo->comps_in_scan) {
    lVar10 = 0;
    do {
      if (cinfo->Ss == 0) {
        if (cinfo->Ah == 0) {
          iVar8 = cinfo->cur_comp_info[lVar10]->dc_tbl_no;
          jpeg_make_d_derived_tbl(cinfo,1,iVar8,(d_derived_tbl **)(&pjVar1[4].start_pass + iVar8));
        }
      }
      else {
        iVar8 = cinfo->cur_comp_info[lVar10]->ac_tbl_no;
        jpeg_make_d_derived_tbl(cinfo,0,iVar8,(d_derived_tbl **)(&pjVar1[4].start_pass + iVar8));
        pjVar1[6].start_pass = (&pjVar1[4].start_pass)[iVar8];
      }
      *(undefined4 *)((long)&pjVar1[2].start_pass + lVar10 * 4 + 4) = 0;
      lVar10 = lVar10 + 1;
    } while (lVar10 < cinfo->comps_in_scan);
  }
  *(undefined4 *)&pjVar1[2].start_pass = 0;
LAB_00110742:
  *(undefined4 *)&pjVar1[1].decode_mcu = 0;
  pjVar1[1].start_pass = (_func_void_j_decompress_ptr *)0x0;
  *(undefined4 *)((long)&pjVar1[3].start_pass + 4) = 0;
  *(uint *)&pjVar1[3].decode_mcu = cinfo->restart_interval;
  return;
}

Assistant:

METHODDEF(void)
start_pass_huff_decoder (j_decompress_ptr cinfo)
{
  huff_entropy_ptr entropy = (huff_entropy_ptr) cinfo->entropy;
  int ci, blkn, tbl, i;
  jpeg_component_info * compptr;

  if (cinfo->progressive_mode) {
    /* Validate progressive scan parameters */
    if (cinfo->Ss == 0) {
      if (cinfo->Se != 0)
	goto bad;
    } else {
      /* need not check Ss/Se < 0 since they came from unsigned bytes */
      if (cinfo->Se < cinfo->Ss || cinfo->Se > cinfo->lim_Se)
	goto bad;
      /* AC scans may have only one component */
      if (cinfo->comps_in_scan != 1)
	goto bad;
    }
    if (cinfo->Ah != 0) {
      /* Successive approximation refinement scan: must have Al = Ah-1. */
      if (cinfo->Ah-1 != cinfo->Al)
	goto bad;
    }
    if (cinfo->Al > 13) {	/* need not check for < 0 */
      /* Arguably the maximum Al value should be less than 13 for 8-bit precision,
       * but the spec doesn't say so, and we try to be liberal about what we
       * accept.  Note: large Al values could result in out-of-range DC
       * coefficients during early scans, leading to bizarre displays due to
       * overflows in the IDCT math.  But we won't crash.
       */
      bad:
      ERREXIT4(cinfo, JERR_BAD_PROGRESSION,
	       cinfo->Ss, cinfo->Se, cinfo->Ah, cinfo->Al);
    }
    /* Update progression status, and verify that scan order is legal.
     * Note that inter-scan inconsistencies are treated as warnings
     * not fatal errors ... not clear if this is right way to behave.
     */
    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      int coefi, cindex = cinfo->cur_comp_info[ci]->component_index;
      int *coef_bit_ptr = & cinfo->coef_bits[cindex][0];
      if (cinfo->Ss && coef_bit_ptr[0] < 0) /* AC without prior DC scan */
	WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, 0);
      for (coefi = cinfo->Ss; coefi <= cinfo->Se; coefi++) {
	int expected = (coef_bit_ptr[coefi] < 0) ? 0 : coef_bit_ptr[coefi];
	if (cinfo->Ah != expected)
	  WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, coefi);
	coef_bit_ptr[coefi] = cinfo->Al;
      }
    }

    /* Select MCU decoding routine */
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_first;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_refine;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_refine;
    }

    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      compptr = cinfo->cur_comp_info[ci];
      /* Make sure requested tables are present, and compute derived tables.
       * We may build same derived table more than once, but it's not expensive.
       */
      if (cinfo->Ss == 0) {
	if (cinfo->Ah == 0) {	/* DC refinement needs no table */
	  tbl = compptr->dc_tbl_no;
	  jpeg_make_d_derived_tbl(cinfo, TRUE, tbl,
				  & entropy->derived_tbls[tbl]);
	}
      } else {
	tbl = compptr->ac_tbl_no;
	jpeg_make_d_derived_tbl(cinfo, FALSE, tbl,
				& entropy->derived_tbls[tbl]);
	/* remember the single active table */
	entropy->ac_derived_tbl = entropy->derived_tbls[tbl];
      }
      /* Initialize DC predictions to 0 */
      entropy->saved.last_dc_val[ci] = 0;
    }

    /* Initialize private state variables */
    entropy->saved.EOBRUN = 0;
  } else {
    /* Check that the scan parameters Ss, Se, Ah/Al are OK for sequential JPEG.
     * This ought to be an error condition, but we make it a warning because
     * there are some baseline files out there with all zeroes in these bytes.
     */
    if (cinfo->Ss != 0 || cinfo->Ah != 0 || cinfo->Al != 0 ||
	((cinfo->is_baseline || cinfo->Se < DCTSIZE2) &&
	cinfo->Se != cinfo->lim_Se))
      WARNMS(cinfo, JWRN_NOT_SEQUENTIAL);

    /* Select MCU decoding routine */
    /* We retain the hard-coded case for full-size blocks.
     * This is not necessary, but it appears that this version is slightly
     * more performant in the given implementation.
     * With an improved implementation we would prefer a single optimized
     * function.
     */
    if (cinfo->lim_Se != DCTSIZE2-1)
      entropy->pub.decode_mcu = decode_mcu_sub;
    else
      entropy->pub.decode_mcu = decode_mcu;

    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      compptr = cinfo->cur_comp_info[ci];
      /* Compute derived values for Huffman tables */
      /* We may do this more than once for a table, but it's not expensive */
      tbl = compptr->dc_tbl_no;
      jpeg_make_d_derived_tbl(cinfo, TRUE, tbl,
			      & entropy->dc_derived_tbls[tbl]);
      if (cinfo->lim_Se) {	/* AC needs no table when not present */
	tbl = compptr->ac_tbl_no;
	jpeg_make_d_derived_tbl(cinfo, FALSE, tbl,
				& entropy->ac_derived_tbls[tbl]);
      }
      /* Initialize DC predictions to 0 */
      entropy->saved.last_dc_val[ci] = 0;
    }

    /* Precalculate decoding info for each block in an MCU of this scan */
    for (blkn = 0; blkn < cinfo->blocks_in_MCU; blkn++) {
      ci = cinfo->MCU_membership[blkn];
      compptr = cinfo->cur_comp_info[ci];
      /* Precalculate which table to use for each block */
      entropy->dc_cur_tbls[blkn] = entropy->dc_derived_tbls[compptr->dc_tbl_no];
      entropy->ac_cur_tbls[blkn] = entropy->ac_derived_tbls[compptr->ac_tbl_no];
      /* Decide whether we really care about the coefficient values */
      if (compptr->component_needed) {
	ci = compptr->DCT_v_scaled_size;
	i = compptr->DCT_h_scaled_size;
	switch (cinfo->lim_Se) {
	case (1*1-1):
	  entropy->coef_limit[blkn] = 1;
	  break;
	case (2*2-1):
	  if (ci <= 0 || ci > 2) ci = 2;
	  if (i <= 0 || i > 2) i = 2;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order2[ci - 1][i - 1];
	  break;
	case (3*3-1):
	  if (ci <= 0 || ci > 3) ci = 3;
	  if (i <= 0 || i > 3) i = 3;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order3[ci - 1][i - 1];
	  break;
	case (4*4-1):
	  if (ci <= 0 || ci > 4) ci = 4;
	  if (i <= 0 || i > 4) i = 4;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order4[ci - 1][i - 1];
	  break;
	case (5*5-1):
	  if (ci <= 0 || ci > 5) ci = 5;
	  if (i <= 0 || i > 5) i = 5;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order5[ci - 1][i - 1];
	  break;
	case (6*6-1):
	  if (ci <= 0 || ci > 6) ci = 6;
	  if (i <= 0 || i > 6) i = 6;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order6[ci - 1][i - 1];
	  break;
	case (7*7-1):
	  if (ci <= 0 || ci > 7) ci = 7;
	  if (i <= 0 || i > 7) i = 7;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order7[ci - 1][i - 1];
	  break;
	default:
	  if (ci <= 0 || ci > 8) ci = 8;
	  if (i <= 0 || i > 8) i = 8;
	  entropy->coef_limit[blkn] = 1 + jpeg_zigzag_order[ci - 1][i - 1];
	  break;
	}
      } else {
	entropy->coef_limit[blkn] = 0;
      }
    }
  }

  /* Initialize bitread state variables */
  entropy->bitstate.bits_left = 0;
  entropy->bitstate.get_buffer = 0; /* unnecessary, but keeps Purify quiet */
  entropy->insufficient_data = FALSE;

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}